

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2780404::GetSseSum16x16DualTest_DISABLED_Speed_Test::TestBody
          (GetSseSum16x16DualTest_DISABLED_Speed_Test *this)

{
  ACMRandom *this_00;
  __time_t _Var1;
  __suseconds_t _Var2;
  __time_t _Var3;
  __suseconds_t _Var4;
  uint uVar5;
  uint32_t uVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  long local_d8;
  int sum_tot_simd;
  ulong local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  int sum_tot_c;
  uint sse_tot_simd;
  uint sse_tot_c;
  uint var2 [2];
  uint var1 [2];
  aom_usec_timer timer;
  uint sse2 [2];
  uint sse1 [2];
  
  iVar9 = (this->super_GetSseSum16x16DualTest).params_.block_size;
  uVar5 = (uint)(1000000000 / (long)iVar9);
  if (0 < iVar9) {
    this_00 = &(this->super_GetSseSum16x16DualTest).rnd_;
    lVar10 = 0;
    do {
      uVar6 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
      (this->super_GetSseSum16x16DualTest).src_[lVar10] = (uint8_t)(uVar6 >> 0x17);
      uVar6 = testing::internal::Random::Generate(&this_00->random_,0x80000000);
      (this->super_GetSseSum16x16DualTest).ref_[lVar10] = (uint8_t)(uVar6 >> 0x17);
      lVar10 = lVar10 + 1;
    } while (lVar10 < (this->super_GetSseSum16x16DualTest).params_.block_size);
  }
  sse1[0] = 0;
  sse1[1] = 0;
  sse2[0] = 0;
  sse2[1] = 0;
  var1[0] = 0;
  var1[1] = 0;
  var2[0] = 0;
  var2[1] = 0;
  sse_tot_c = 0;
  sse_tot_simd = 0;
  sum_tot_c = 0;
  sum_tot_simd = 0;
  local_b8 = (long)(this->super_GetSseSum16x16DualTest).params_.width;
  gettimeofday((timeval *)&timer,(__timezone_ptr_t)0x0);
  lVar10 = local_b8;
  if (0 < (int)uVar5) {
    local_c0 = local_b8 << 4;
    uVar8 = 0;
    do {
      local_c8 = uVar8;
      if (0 < (this->super_GetSseSum16x16DualTest).params_.height) {
        local_d8 = 0;
        lVar11 = 0;
        do {
          local_b0 = lVar11;
          if (0 < (this->super_GetSseSum16x16DualTest).params_.width) {
            iVar9 = 0;
            lVar11 = local_d8;
            do {
              aom_get_var_sse_sum_16x16_dual_c
                        ((this->super_GetSseSum16x16DualTest).src_ + lVar11,(int)lVar10,
                         (this->super_GetSseSum16x16DualTest).ref_ + lVar11,(int)lVar10,sse2,
                         &sse_tot_c,&sum_tot_c,var2);
              iVar9 = iVar9 + 0x20;
              lVar11 = lVar11 + 0x20;
            } while (iVar9 < (this->super_GetSseSum16x16DualTest).params_.width);
          }
          lVar11 = local_b0 + 0x10;
          local_d8 = local_d8 + local_c0;
        } while (lVar11 < (this->super_GetSseSum16x16DualTest).params_.height);
      }
      uVar7 = (int)local_c8 + 1;
      uVar8 = (ulong)uVar7;
    } while (uVar7 != uVar5);
  }
  uVar8 = 0;
  gettimeofday((timeval *)&timer.end,(__timezone_ptr_t)0x0);
  _Var4 = timer.end.tv_usec;
  _Var3 = timer.end.tv_sec;
  _Var2 = timer.begin.tv_usec;
  _Var1 = timer.begin.tv_sec;
  gettimeofday((timeval *)&timer,(__timezone_ptr_t)0x0);
  lVar10 = local_b8;
  if (0 < (int)uVar5) {
    local_c0 = local_b8 << 4;
    do {
      local_c8 = uVar8;
      if (0 < (this->super_GetSseSum16x16DualTest).params_.height) {
        local_d8 = 0;
        lVar11 = 0;
        do {
          local_b0 = lVar11;
          if (0 < (this->super_GetSseSum16x16DualTest).params_.width) {
            iVar9 = 0;
            lVar11 = local_d8;
            do {
              (*(this->super_GetSseSum16x16DualTest).params_.func)
                        ((this->super_GetSseSum16x16DualTest).src_ + lVar11,(int)lVar10,
                         (this->super_GetSseSum16x16DualTest).ref_ + lVar11,(int)lVar10,sse1,
                         &sse_tot_simd,&sum_tot_simd,var1);
              iVar9 = iVar9 + 0x20;
              lVar11 = lVar11 + 0x20;
            } while (iVar9 < (this->super_GetSseSum16x16DualTest).params_.width);
          }
          lVar11 = local_b0 + 0x10;
          local_d8 = local_d8 + local_c0;
        } while (lVar11 < (this->super_GetSseSum16x16DualTest).params_.height);
      }
      uVar7 = (int)local_c8 + 1;
      uVar8 = (ulong)uVar7;
    } while (uVar7 != uVar5);
  }
  lVar11 = _Var4 - _Var2;
  lVar10 = lVar11 + 1000000;
  if (-1 < lVar11) {
    lVar10 = lVar11;
  }
  dVar12 = (double)(lVar10 + ((lVar11 >> 0x3f) + (_Var3 - _Var1)) * 1000000);
  gettimeofday((timeval *)&timer.end,(__timezone_ptr_t)0x0);
  lVar11 = timer.end.tv_usec - timer.begin.tv_usec;
  lVar10 = lVar11 + 1000000;
  if (-1 < lVar11) {
    lVar10 = lVar11;
  }
  dVar13 = (double)(((lVar11 >> 0x3f) + (timer.end.tv_sec - timer.begin.tv_sec)) * 1000000 + lVar10)
  ;
  printf("aom_getvar_16x16_dual for block=%dx%d : ref_time=%lf \t simd_time=%lf \t gain=%lf \n",
         dVar12,dVar13,dVar12 / dVar13,
         (ulong)(uint)(this->super_GetSseSum16x16DualTest).params_.width,
         (ulong)(uint)(this->super_GetSseSum16x16DualTest).params_.height);
  return;
}

Assistant:

TEST_P(GetSseSum16x16DualTest, DISABLED_Speed) { SseSum_SpeedTestDual(); }